

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_evaluateSolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Result simplificationStatus)

{
  bool bVar1;
  type_conflict5 tVar2;
  Verbosity VVar3;
  Status SVar4;
  int in_ESI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *unaff_retaddr;
  bool *in_stack_00000050;
  bool in_stack_0000005f;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000060;
  bool in_stack_000000b7;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000000b8;
  Verbosity old_verbosity_3;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000100;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int polishing;
  Verbosity old_verbosity;
  undefined4 in_stack_fffffffffffffe58;
  SPxStatus in_stack_fffffffffffffe5c;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  undefined1 in_stack_ffffffffffffff1f;
  int in_stack_ffffffffffffff20;
  IntParam in_stack_ffffffffffffff24;
  Verbosity in_stack_ffffffffffffff28;
  Verbosity in_stack_ffffffffffffff2c;
  Verbosity local_30;
  Verbosity local_2c;
  Real local_28;
  Verbosity local_20;
  Verbosity local_1c;
  int local_18;
  Verbosity local_14;
  Verbosity local_10;
  int local_c;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  Result simplificationStatus_00;
  
  pSVar5 = in_RDI;
  if (in_ESI == 0) {
    SVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::status((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    in_RDI->_status = SVar4;
  }
  else {
    if (in_ESI - 1U < 3) {
      in_RDI->_hasBasis = false;
      local_c = in_ESI;
      bVar1 = boolParam(in_RDI,ENSURERAY);
      if (!bVar1) {
        if (local_c == 1) {
          in_RDI->_status = INFEASIBLE;
        }
        else if (local_c == 3) {
          in_RDI->_status = UNBOUNDED;
        }
        else {
          in_RDI->_status = INForUNBD;
        }
        _loadRealLP(in_stack_fffffffffffffe60,SUB41((uint)in_stack_fffffffffffffe5c >> 0x18,0));
        return;
      }
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
        local_10 = SPxOut::getVerbosity(&in_RDI->spxout);
        local_14 = INFO1;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_14);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe60,
                           (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe60,
                           (_func_ostream_ptr_ostream_ptr *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        SPxOut::setVerbosity(&in_RDI->spxout,&local_10);
      }
      _preprocessAndSolveReal(in_stack_00000060,in_stack_0000005f,in_stack_00000050);
      return;
    }
    if (in_ESI == 4) {
      in_RDI->_status = OPTIMAL;
      _storeSolutionRealFromPresol(in_stack_00000100);
      return;
    }
  }
  simplificationStatus_00 = (Result)((ulong)pSVar5 >> 0x20);
  switch(in_RDI->_status) {
  case OPTIMAL:
    _storeSolutionReal(in_stack_000000b8,in_stack_000000b7);
    if ((in_RDI->_applyPolishing & 1U) != 0) {
      local_18 = intParam(in_RDI,SOLUTION_POLISHING);
      setIntParam((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                  in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                  (bool)in_stack_ffffffffffffff1f);
      _preprocessAndSolveReal(in_stack_00000060,in_stack_0000005f,in_stack_00000050);
    }
    break;
  case UNBOUNDED:
  case INFEASIBLE:
  case INForUNBD:
    if (((in_RDI->_isRealLPLoaded & 1U) == 0) && (bVar1 = boolParam(in_RDI,ENSURERAY), bVar1)) {
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
        local_1c = SPxOut::getVerbosity(&in_RDI->spxout);
        local_20 = INFO1;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_20);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe60,
                           (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe60,
                           (_func_ostream_ptr_ostream_ptr *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        SPxOut::setVerbosity(&in_RDI->spxout,&local_1c);
      }
      local_28 = realParam(in_RDI,OBJ_OFFSET);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::changeObjOffset<double>
                ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),(double *)0x613093
                );
      _resolveWithoutPreprocessing(unaff_retaddr,simplificationStatus_00);
    }
    else {
      _storeSolutionReal(in_stack_000000b8,in_stack_000000b7);
    }
    break;
  case ABORT_CYCLING:
    if (((in_RDI->_isRealLPLoaded & 1U) == 0) || ((in_RDI->_isRealLPScaled & 1U) != 0)) {
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
        SPxOut::getVerbosity(&in_RDI->spxout);
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xffffffffffffff28);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe60,
                           (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe60,
                           (_func_ostream_ptr_ostream_ptr *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xffffffffffffff2c);
      }
      _storeSolutionReal(in_stack_000000b8,in_stack_000000b7);
      return;
    }
    bVar1 = SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isPrimalFeasible(&in_RDI->_solReal);
    if ((bVar1) ||
       (bVar1 = SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isDualFeasible(&in_RDI->_solReal), bVar1)) {
      in_RDI->_status = OPTIMAL_UNSCALED_VIOLATIONS;
    }
  case ABORT_TIME:
  case ABORT_ITER:
  case REGULAR:
  case RUNNING:
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shift((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::epsilon((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x613351);
    if (tVar2) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasisStatus((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    }
    _storeSolutionReal(in_stack_000000b8,in_stack_000000b7);
    break;
  case ABORT_VALUE:
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::shift((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::epsilon((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6131d4);
    if (tVar2) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasisStatus((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    }
    _storeSolutionReal(in_stack_000000b8,in_stack_000000b7);
    break;
  case SINGULAR:
    if ((in_RDI->_isRealLPLoaded & 1U) == 0) {
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
        local_2c = SPxOut::getVerbosity(&in_RDI->spxout);
        local_30 = INFO1;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_30);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe60,
                           (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffe60,
                           (_func_ostream_ptr_ostream_ptr *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        SPxOut::setVerbosity(&in_RDI->spxout,&local_2c);
      }
      _preprocessAndSolveReal(in_stack_00000060,in_stack_0000005f,in_stack_00000050);
    }
    else {
      in_RDI->_hasBasis = false;
    }
    break;
  default:
    in_RDI->_hasBasis = false;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_evaluateSolutionReal(typename SPxSimplifier<R>::Result simplificationStatus)
{
   // if the simplifier detected infeasibility or unboundedness we optimize again
   // just to get the proof (primal or dual ray)
   // todo get infeasibility proof from simplifier
   switch(simplificationStatus)
   {
   case SPxSimplifier<R>::INFEASIBLE:
   case SPxSimplifier<R>::DUAL_INFEASIBLE:
   case SPxSimplifier<R>::UNBOUNDED:
      _hasBasis = false;

      if(boolParam(SoPlexBase<R>::ENSURERAY))
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "simplifier detected infeasibility or unboundedness - solve again without simplifying" << std::endl;
                      )
         _preprocessAndSolveReal(false);
      }
      else
      {
         if(simplificationStatus == SPxSimplifier<R>::INFEASIBLE)
            _status = SPxSolverBase<R>::INFEASIBLE;
         else if(simplificationStatus == SPxSimplifier<R>::UNBOUNDED)
            _status = SPxSolverBase<R>::UNBOUNDED;
         else
            _status = SPxSolverBase<R>::INForUNBD;

         // load original LP to restore clean solver state
         _loadRealLP(false);
      }

      return;

   case SPxSimplifier<R>::VANISHED:
      _status = SPxSolverBase<R>::OPTIMAL;
      _storeSolutionRealFromPresol();
      return;

   case SPxSimplifier<R>::OKAY:
      _status = _solver.status();
   }

   // process result
   switch(_status)
   {
   case SPxSolverBase<R>::OPTIMAL:
      _storeSolutionReal(!_isRealLPLoaded || _isRealLPScaled);

      // apply polishing on original problem
      if(_applyPolishing)
      {
         int polishing = intParam(SoPlexBase<R>::SOLUTION_POLISHING);
         setIntParam(SoPlexBase<R>::SOLUTION_POLISHING, polishing);
         _preprocessAndSolveReal(false);
      }

      break;

   case SPxSolverBase<R>::UNBOUNDED:
   case SPxSolverBase<R>::INFEASIBLE:
   case SPxSolverBase<R>::INForUNBD:

      // in case of infeasibility or unboundedness, we currently can not unsimplify, but have to solve the original LP again
      if(!_isRealLPLoaded && boolParam(SoPlexBase<R>::ENSURERAY))
      {
         SPX_MSG_INFO1(spxout, spxout << " --- loading original problem" << std::endl;)
         _solver.changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));
         // we cannot do more to remove violations
         _resolveWithoutPreprocessing(simplificationStatus);
      }
      else
      {
         _storeSolutionReal(false);
      }

      break;

   case SPxSolverBase<R>::SINGULAR:

      // if preprocessing was applied, try to run again without to avoid singularity
      if(!_isRealLPLoaded)
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "encountered singularity - trying to solve again without simplifying" <<
                       std::endl;)
         _preprocessAndSolveReal(false);
         return;
      }

      _hasBasis = false;
      break;

   case SPxSolverBase<R>::ABORT_VALUE:

      // If we aborted the solve for some reason and there is still a shift, ensure that the basis status is correct
      if(_solver.shift() > _solver.epsilon())
         _solver.setBasisStatus(SPxBasisBase<R>::REGULAR);

      _storeSolutionReal(true);
      break;

   case SPxSolverBase<R>::ABORT_CYCLING:

      // if preprocessing or scaling was applied, try to run again without to
      // avoid cycling
      if(!_isRealLPLoaded || _isRealLPScaled)
      {
         SPX_MSG_INFO1(spxout, spxout << "encountered cycling - trying to solve again without simplifying" <<
                       std::endl;)
         // store and unsimplify sub-optimal solution and basis, may trigger re-solve
         _storeSolutionReal(true);
         return;
      }

      if(_solReal.isPrimalFeasible() || _solReal.isDualFeasible())
         _status = SPxSolverBase<R>::OPTIMAL_UNSCALED_VIOLATIONS;

   // FALLTHROUGH
   case SPxSolverBase<R>::ABORT_TIME:
   case SPxSolverBase<R>::ABORT_ITER:
   case SPxSolverBase<R>::REGULAR:
   case SPxSolverBase<R>::RUNNING:

      // If we aborted the solve for some reason and there is still a shift, ensure that the basis status is correct
      if(_solver.shift() > _solver.epsilon())
         _solver.setBasisStatus(SPxBasisBase<R>::REGULAR);

      _storeSolutionReal(false);
      break;

   default:
      _hasBasis = false;
      break;
   }
}